

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsWorthSpecializingToInt32(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  undefined2 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  Opnd *src;
  Instr *local_50;
  Instr *instrNext;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d46,"(instr)","instr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(instr);
  src = IR::Instr::GetSrc2(instr);
  bVar4 = IsWorthSpecializingToInt32DueToSrc(this,pOVar6,src1Val);
  if ((bVar4) ||
     ((src2Val != (Value *)0x0 &&
      (bVar4 = IsWorthSpecializingToInt32DueToSrc(this,src,src2Val), bVar4)))) {
    return true;
  }
  instrNext = (Instr *)IR::Instr::GetDst(instr);
  if ((instrNext == (Instr *)0x0) ||
     (bVar4 = IsWorthSpecializingToInt32DueToDst(this,(Opnd *)instrNext), bVar4)) {
    return true;
  }
  bVar4 = IR::Opnd::IsEqual((Opnd *)instrNext,pOVar6);
  if ((bVar4) ||
     ((src2Val != (Value *)0x0 &&
      ((bVar4 = IR::Opnd::IsEqual((Opnd *)instrNext,src), bVar4 ||
       (bVar4 = IR::Opnd::IsEqual(pOVar6,src), bVar4)))))) {
    return true;
  }
  local_50 = IR::Instr::GetNextRealInstrOrLabel(instr);
  do {
    OVar1 = local_50->m_opcode;
    if (OVar1 == Ld_A) {
      pOVar6 = IR::Instr::GetSrc1(local_50);
      bVar4 = IR::Opnd::IsEqual((Opnd *)instrNext,pOVar6);
      if (!bVar4) break;
      instrNext = (Instr *)IR::Instr::GetDst(local_50);
    }
    else if (((((OVar1 != LdFld) && (OVar1 != LdFldForTypeOf)) && (OVar1 != LdRootFld)) &&
             ((OVar1 != LdElemI_A && (OVar1 != LdRootFldForTypeOf)))) && (OVar1 != ByteCodeUses))
    break;
    local_50 = IR::Instr::GetNextRealInstrOrLabel(local_50);
  } while( true );
  pOVar6 = IR::Instr::GetSrc1(local_50);
  if (pOVar6 != (Opnd *)0x0) {
    pOVar6 = IR::Instr::GetSrc1(local_50);
    bVar4 = IR::Opnd::IsEqual((Opnd *)instrNext,pOVar6);
    if (bVar4) goto LAB_0059fac1;
  }
  pOVar6 = IR::Instr::GetSrc2(local_50);
  if (pOVar6 == (Opnd *)0x0) {
    return false;
  }
  pOVar6 = IR::Instr::GetSrc2(local_50);
  bVar4 = IR::Opnd::IsEqual((Opnd *)instrNext,pOVar6);
  if (!bVar4) {
    return false;
  }
LAB_0059fac1:
  uVar2 = local_50->m_opcode;
  if (((((3 < (ushort)(uVar2 - 0x26)) && (1 < (ushort)(uVar2 - 0x2d))) &&
       ((1 < (ushort)(uVar2 - 0x30) &&
        (((uVar2 != 0x33 && (4 < (ushort)(uVar2 - 0x35))) && (uVar2 != 0x43)))))) &&
      ((3 < (ushort)(uVar2 - 0x1a5) && (uVar2 != 0x1aa)))) &&
     ((uVar2 != 0x1ac && ((uVar2 != 0x1ae && (uVar2 != 0x1b0)))))) {
    return false;
  }
  return true;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32(IR::Instr *const instr, Value *const src1Val, Value *const src2Val)
{
    Assert(instr);

    const auto src1 = instr->GetSrc1();
    const auto src2 = instr->GetSrc2();

    // In addition to checking each operand and the destination, if for any reason we only have to do a maximum of two
    // conversions instead of the worst-case 3 conversions, it's probably worth specializing.
    if (IsWorthSpecializingToInt32DueToSrc(src1, src1Val) ||
        (src2Val && IsWorthSpecializingToInt32DueToSrc(src2, src2Val)))
    {
        return true;
    }

    IR::Opnd *dst = instr->GetDst();
    if (!dst || IsWorthSpecializingToInt32DueToDst(dst))
    {
        return true;
    }

    if (dst->IsEqual(src1) || (src2Val && (dst->IsEqual(src2) || src1->IsEqual(src2))))
    {
        return true;
    }

    IR::Instr *instrNext = instr->GetNextRealInstrOrLabel();

    // Skip useless Ld_A's
    do
    {
        switch (instrNext->m_opcode)
        {
        case Js::OpCode::Ld_A:
            if (!dst->IsEqual(instrNext->GetSrc1()))
            {
                goto done;
            }
            dst = instrNext->GetDst();
            break;
        case Js::OpCode::LdFld:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdElemI_A:
        case Js::OpCode::ByteCodeUses:
            break;
        default:
            goto done;
        }

        instrNext = instrNext->GetNextRealInstrOrLabel();
    } while (true);
done:

    // If the next instr could also be type specialized, then it is probably worth it.
    if ((instrNext->GetSrc1() && dst->IsEqual(instrNext->GetSrc1())) || (instrNext->GetSrc2() && dst->IsEqual(instrNext->GetSrc2())))
    {
        switch (instrNext->m_opcode)
        {
        case Js::OpCode::Add_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::Xor_A:
        case Js::OpCode::And_A:
        case Js::OpCode::Or_A:
        case Js::OpCode::Shl_A:
        case Js::OpCode::Shr_A:
        case Js::OpCode::Incr_A:
        case Js::OpCode::Decr_A:
        case Js::OpCode::Neg_A:
        case Js::OpCode::Not_A:
        case Js::OpCode::Conv_Num:
        case Js::OpCode::BrEq_I4:
        case Js::OpCode::BrTrue_I4:
        case Js::OpCode::BrFalse_I4:
        case Js::OpCode::BrGe_I4:
        case Js::OpCode::BrGt_I4:
        case Js::OpCode::BrLt_I4:
        case Js::OpCode::BrLe_I4:
        case Js::OpCode::BrNeq_I4:
            return true;
        }
    }

    return false;
}